

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

void InitLexer(Lexer *lexer,char *rawSourceCode)

{
  size_t sVar1;
  
  lexer->rawSourceCode = rawSourceCode;
  sVar1 = strlen(rawSourceCode);
  lexer->length = (int)sVar1;
  lexer->currentTokenString = (char *)0x0;
  (lexer->tracker).currentTokenPosition = 0;
  (lexer->tracker).tokenStart = 0;
  (lexer->tracker).tokenEnd = 0;
  (lexer->tracker).row = 1;
  (lexer->tracker).col = 1;
  lexer->totalTrackers = 5;
  lexer->previousTrackers[0].tokenStart = 0;
  lexer->previousTrackers[0].tokenEnd = 0;
  lexer->previousTrackers[0].currentTokenPosition = 0;
  lexer->previousTrackers[0].row = 0;
  *(undefined8 *)&lexer->previousTrackers[0].col = 0;
  lexer->previousTrackers[1].tokenEnd = 0;
  lexer->previousTrackers[1].currentTokenPosition = 0;
  lexer->previousTrackers[1].row = 0;
  lexer->previousTrackers[1].col = 0;
  lexer->previousTrackers[2].tokenStart = 0;
  lexer->previousTrackers[2].tokenEnd = 0;
  lexer->previousTrackers[2].currentTokenPosition = 0;
  lexer->previousTrackers[2].row = 0;
  *(undefined8 *)&lexer->previousTrackers[2].col = 0;
  lexer->previousTrackers[3].tokenEnd = 0;
  lexer->previousTrackers[3].currentTokenPosition = 0;
  lexer->previousTrackers[3].row = 0;
  lexer->previousTrackers[3].col = 0;
  lexer->previousTrackers[4].tokenStart = 0;
  lexer->previousTrackers[4].tokenEnd = 0;
  lexer->previousTrackers[4].currentTokenPosition = 0;
  lexer->previousTrackers[4].row = 0;
  *(undefined8 *)&lexer->previousTrackers[4].col = 0xffffffff00000000;
  return;
}

Assistant:

void InitLexer(Lexer* lexer, char* rawSourceCode){
	// Init lexer
	lexer->rawSourceCode = rawSourceCode;
	lexer->length = strlen(rawSourceCode);
	lexer->currentTokenString = NULL;

	// Init lexer tracker
	lexer->tracker.currentTokenPosition = 0;
	lexer->tracker.tokenStart = 0;
	lexer->tracker.tokenEnd = 0;
	lexer->tracker.row = 1;
	lexer->tracker.col = 1;
	lexer->previousTrackerSpot = -1;
	lexer->totalTrackers = 5;

	for (int i = 0; i < lexer->totalTrackers; i++) {
		lexer->previousTrackers[i].col = 0;
		lexer->previousTrackers[i].row = 0;
		lexer->previousTrackers[i].tokenEnd = 0;
		lexer->previousTrackers[i].tokenStart = 0;
		lexer->previousTrackers[i].currentTokenPosition = 0;
	}
}